

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PackedArrayType *type,string_view param_2)

{
  pointer pCVar1;
  Type *pTVar2;
  Type *pTVar3;
  ConstantRange *range;
  pointer pCVar4;
  string_view fmt;
  format_args args;
  SmallVector<slang::ConstantRange,_8UL> dims;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  int32_t local_98;
  SmallVectorBase<slang::ConstantRange> local_88 [2];
  
  local_88[0].len = 0;
  local_88[0].cap = 8;
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  while( true ) {
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
              (local_88,&type->range);
    pTVar2 = type->elementType;
    pTVar3 = pTVar2->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(pTVar2);
      pTVar3 = pTVar2->canonical;
    }
    pTVar2 = type->elementType;
    if ((pTVar3->super_Symbol).kind != PackedArrayType) break;
    type = (PackedArrayType *)pTVar2->canonical;
    if (type == (PackedArrayType *)0x0) {
      Type::resolveCanonical(pTVar2);
      type = (PackedArrayType *)pTVar2->canonical;
    }
  }
  local_a8._M_len = 0;
  local_a8._M_str = "";
  Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
            (&pTVar2->super_Symbol,this,&local_a8);
  if (local_88[0].len != 0) {
    pCVar1 = local_88[0].data_ + local_88[0].len;
    pCVar4 = local_88[0].data_;
    do {
      local_a8._M_len = CONCAT44(local_a8._M_len._4_4_,pCVar4->left);
      local_98 = pCVar4->right;
      fmt.size_ = 7;
      fmt.data_ = "[{}:{}]";
      args.field_1.values_ = (value<fmt::v11::context> *)&local_a8;
      args.desc_ = 0x11;
      ::fmt::v11::detail::vformat_to
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
                 (locale_ref)0x0);
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar1);
  }
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    operator_delete(local_88[0].data_);
  }
  return;
}

Assistant:

void TypePrinter::visit(const PackedArrayType& type, std::string_view) {
    SmallVector<ConstantRange, 8> dims;
    const PackedArrayType* curr = &type;
    while (true) {
        dims.push_back(curr->range);
        if (!curr->elementType.isPackedArray())
            break;

        curr = &curr->elementType.getCanonicalType().as<PackedArrayType>();
    }

    curr->elementType.visit(*this, ""sv);
    for (auto& range : dims)
        buffer->format("[{}:{}]", range.left, range.right);
}